

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::
GenerateSibling<google::protobuf::compiler::java::MessageGenerator,google::protobuf::Descriptor>
          (java *this,string *package_dir,string *java_package,Descriptor *descriptor,
          GeneratorContext *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *file_list,bool annotate_code,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *annotation_list,string *name_suffix,MessageGenerator *generator,bool opensource_runtime,
          offset_in_MessageGenerator_to_subr pfn)

{
  undefined8 *puVar1;
  ZeroCopyOutputStream *output;
  ZeroCopyOutputStream *output_00;
  AlphaNum *annotation_collector_00;
  code *pcVar2;
  long *plVar3;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  undefined7 in_stack_00000009;
  undefined7 in_stack_00000029;
  string info_full_path;
  GeneratedCodeInfo annotations;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  Printer printer;
  char local_23c;
  string local_228;
  undefined1 local_208 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  AlphaNum local_1d8;
  basic_string_view<char,_std::char_traits<char>_> local_1a8;
  AlphaNum local_198;
  Printer local_168;
  
  pcVar2 = (code *)CONCAT71(in_stack_00000029,opensource_runtime);
  local_168.sink_.buffer_ = *(void **)this;
  local_168.sink_.stream_ = *(ZeroCopyOutputStream **)(this + 8);
  local_1d8.piece_._M_len = (size_t)*(ushort *)(java_package->field_2)._M_allocated_capacity;
  local_1d8.piece_._M_str =
       (char *)(~local_1d8.piece_._M_len + (long)(java_package->field_2)._M_allocated_capacity);
  local_208._8_8_ =
       (annotation_list->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_208._0_8_ =
       (annotation_list->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_198.piece_._M_len = 5;
  local_198.piece_._M_str = ".java";
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_228,(lts_20250127 *)&local_168,&local_1d8,(AlphaNum *)local_208,&local_198,
             (AlphaNum *)file_list);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)context,&local_228);
  local_168.sink_.stream_ = (ZeroCopyOutputStream *)local_228._M_string_length;
  local_168.sink_.buffer_ = local_228._M_dataplus._M_p;
  local_1d8.piece_._M_len = (size_t)&DAT_00000008;
  local_1d8.piece_._M_str = ".pb.meta";
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_208,(lts_20250127 *)&local_168,&local_1d8,
             (AlphaNum *)local_228._M_string_length);
  GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)&local_1d8,(Arena *)0x0);
  local_198.piece_._M_len = (size_t)&PTR__AnnotationCollector_00847168;
  local_198.piece_._M_str = (char *)&local_1d8;
  output = (ZeroCopyOutputStream *)(**(code **)(*(long *)descriptor + 0x10))(descriptor,&local_228);
  local_23c = (char)file_list;
  annotation_collector_00 = (AlphaNum *)0x0;
  if (local_23c != '\0') {
    annotation_collector_00 = &local_198;
  }
  io::Printer::Printer(&local_168,output,'$',(AnnotationCollector *)annotation_collector_00);
  puVar1 = *(undefined8 **)(*(long *)((long)&java_package->field_2 + 8) + 8);
  local_1a8._M_str = (char *)*puVar1;
  local_1a8._M_len = puVar1[1];
  text._M_str = 
  "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// NO CHECKED-IN PROTOBUF GENCODE\n// source: $filename$\n"
  ;
  text._M_len = 0x74;
  io::Printer::Print<char[9],std::basic_string_view<char,std::char_traits<char>>>
            (&local_168,text,(char (*) [9])"filename",&local_1a8);
  if ((char)generator != '\0') {
    text_00._M_str = "// Protobuf Java Version: $protobuf_java_version$\n";
    text_00._M_len = 0x32;
    io::Printer::Print<char[22],char[11]>
              (&local_168,text_00,(char (*) [22])"protobuf_java_version",(char (*) [11])"4.31.0-dev"
              );
  }
  text_01._M_str = "\n";
  text_01._M_len = 1;
  io::Printer::Print<>(&local_168,text_01);
  if (package_dir->_M_string_length != 0) {
    text_02._M_str = "package $package$;\n\n";
    text_02._M_len = 0x14;
    io::Printer::Print<char[8],std::__cxx11::string>
              (&local_168,text_02,(char (*) [8])0x6a5a33,package_dir);
  }
  plVar3 = (long *)((long)&(name_suffix->_M_dataplus)._M_p + pfn);
  if (opensource_runtime) {
    pcVar2 = *(code **)(pcVar2 + *plVar3 + -1);
  }
  (*pcVar2)(plVar3,&local_168);
  if (local_23c != '\0') {
    output_00 = (ZeroCopyOutputStream *)
                (**(code **)(*(long *)descriptor + 0x10))(descriptor,local_208);
    MessageLite::SerializeToZeroCopyStream((MessageLite *)&local_1d8,output_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT71(in_stack_00000009,annotate_code),(value_type *)local_208);
    if (output_00 != (ZeroCopyOutputStream *)0x0) {
      (*output_00->_vptr_ZeroCopyOutputStream[1])(output_00);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_168.line_start_variables_);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                   *)&local_168.substitutions_);
  (*local_168.substitution_listener_.
    super_Impl<void_(std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation)>
    .
    super_CoreImpl<false,_void,_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation>
    .manager_)(dispose,(TypeErasedState *)&local_168.substitution_listener_,
               (TypeErasedState *)&local_168.substitution_listener_);
  std::
  vector<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  ::~vector(&local_168.annotation_lookups_);
  std::
  vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  ::~vector(&local_168.var_lookups_);
  if (local_168.paren_depth_to_omit_.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.paren_depth_to_omit_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168.paren_depth_to_omit_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.paren_depth_to_omit_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_168.sink_.buffer_size_ != 0) {
    (**(code **)(((string_view *)&(local_168.sink_.stream_)->_vptr_ZeroCopyOutputStream)->_M_len +
                0x18))();
  }
  if (output != (ZeroCopyOutputStream *)0x0) {
    (*output->_vptr_ZeroCopyOutputStream[1])(output);
  }
  GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)&local_1d8);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208._0_8_ !=
      &local_1f8) {
    operator_delete((void *)local_208._0_8_,(long)local_1f8._M_dataplus._M_p + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void GenerateSibling(
    const std::string& package_dir, const std::string& java_package,
    const DescriptorClass* descriptor, GeneratorContext* context,
    std::vector<std::string>* file_list, bool annotate_code,
    std::vector<std::string>* annotation_list, const std::string& name_suffix,
    GeneratorClass* generator, bool opensource_runtime,
    void (GeneratorClass::*pfn)(io::Printer* printer)) {
  std::string filename =
      absl::StrCat(package_dir, descriptor->name(), name_suffix, ".java");
  file_list->push_back(filename);
  std::string info_full_path = absl::StrCat(filename, ".pb.meta");
  GeneratedCodeInfo annotations;
  io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
      &annotations);

  std::unique_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
  io::Printer printer(output.get(), '$',
                      annotate_code ? &annotation_collector : nullptr);

  printer.Print(
      "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
      "// NO CHECKED-IN PROTOBUF "
      // Intentional line breaker
      "GENCODE\n"
      "// source: $filename$\n",
      "filename", descriptor->file()->name());
  if (opensource_runtime) {
    printer.Print("// Protobuf Java Version: $protobuf_java_version$\n",
                  "protobuf_java_version", PROTOBUF_JAVA_VERSION_STRING);
  }
  printer.Print("\n");
  if (!java_package.empty()) {
    printer.Print(
        "package $package$;\n"
        "\n",
        "package", java_package);
  }

  (generator->*pfn)(&printer);

  if (annotate_code) {
    std::unique_ptr<io::ZeroCopyOutputStream> info_output(
        context->Open(info_full_path));
    annotations.SerializeToZeroCopyStream(info_output.get());
    annotation_list->push_back(info_full_path);
  }
}